

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdIndex(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  x86Reg reg1_00;
  uint uVar1;
  x86Command op;
  uint multiplier;
  
  ctx->vmState->errorOutOfBoundsWrap = ErrorOutOfBoundsWrap;
  reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
  reg1_00 = CodeGenGenericContext::GetReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,reg1,sDWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  uVar1 = cmd.argument;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rECX,sDWORD,rEBX,uVar1 >> 0xd & 0x7f8);
  EMIT_OP_REG_REG(&ctx->ctx,o_cmp,reg1,rECX);
  EMIT_OP_LABEL(&ctx->ctx,o_jb,ctx->labelCount,0,0);
  EMIT_OP_NUM(&ctx->ctx,o_set_tracking,0);
  EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR13);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDI,0x168,ctx->currInstructionPos);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xe8);
  EMIT_OP_NUM(&ctx->ctx,o_set_tracking,1);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1_00,sQWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  multiplier = uVar1 & 0xffff;
  switch(multiplier) {
  case 1:
    break;
  case 2:
    multiplier = 2;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_002a8ca9_caseD_3:
    uVar1 = uVar1 & 0xffff;
    op = o_imul;
    goto LAB_002a8cd8;
  case 4:
    multiplier = 4;
    break;
  case 8:
    multiplier = 8;
    break;
  default:
    if (multiplier != 0x10) goto switchD_002a8ca9_caseD_3;
    op = o_shl;
    uVar1 = 4;
LAB_002a8cd8:
    EMIT_OP_REG_NUM(&ctx->ctx,op,reg1,uVar1);
    multiplier = 1;
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,reg1_00,sQWORD,reg1,multiplier,reg1_00,0);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,reg1_00);
  return;
}

Assistant:

void GenCodeCmdIndex(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->errorOutOfBoundsWrap = ErrorOutOfBoundsWrap;

#if defined(_M_X64)
	x86Reg indexReg = ctx.ctx.GetReg();
	x86Reg pointerReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, indexReg, sDWORD, rREG, cmd.rB * 8); // Load index with zero extension to use in lea (top RAX bits are cleared)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rECX, sDWORD, rREG, ((cmd.argument >> 16) & 0xff) * 8); // Load size

	EMIT_OP_REG_REG(ctx.ctx, o_cmp, indexReg, rECX);
	EMIT_OP_LABEL(ctx.ctx, o_jb, ctx.labelCount, false);

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 0);

	EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg1, rR13);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->callInstructionPos) - uintptr_t(ctx.vmState)), ctx.currInstructionPos);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->errorOutOfBoundsWrap) - uintptr_t(ctx.vmState)));

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 1);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, pointerReg, sQWORD, rREG, cmd.rC * 8); // Load source pointer

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	// Multiply index by size and add to source pointer
	unsigned size = (cmd.argument & 0xffff);

	if(size == 1)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, pointerReg, sQWORD, indexReg, 1, pointerReg, 0);
	}
	else if(size == 2)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, pointerReg, sQWORD, indexReg, 2, pointerReg, 0);
	}
	else if(size == 4)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, pointerReg, sQWORD, indexReg, 4, pointerReg, 0);
	}
	else if(size == 8)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, pointerReg, sQWORD, indexReg, 8, pointerReg, 0);
	}
	else if(size == 16)
	{
		EMIT_OP_REG_NUM(ctx.ctx, o_shl, indexReg, 4); // 32 bit shift is ok, top bits are zero
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, pointerReg, sQWORD, indexReg, 1, pointerReg, 0);
	}
	else
	{
		EMIT_OP_REG_NUM(ctx.ctx, o_imul, indexReg, size); // 32 bit multiplication is ok, top bits are zero
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, pointerReg, sQWORD, indexReg, 1, pointerReg, 0);
	}

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, pointerReg); // Store to target
#else
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8); // Load inde
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rECX, sDWORD, rREG, ((cmd.argument >> 16) & 0xff) * 8); // Load size

	EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEAX, rECX);
	EMIT_OP_LABEL(ctx.ctx, o_jb, ctx.labelCount, false);

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 0);

	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->callInstructionPos), ctx.currInstructionPos);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->errorOutOfBoundsWrap));

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 1);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rC * 8); // Load source pointer

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	// Multiply index by size and add to source pointer
	unsigned size = (cmd.argument & 0xffff);

	if(size == 1)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEAX, sDWORD, rEAX, 1, rEDX, 0);
	}
	else if(size == 2)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEAX, sDWORD, rEAX, 2, rEDX, 0);
	}
	else if(size == 4)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEAX, sDWORD, rEAX, 4, rEDX, 0);
	}
	else if(size == 8)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEAX, sDWORD, rEAX, 8, rEDX, 0);
	}
	else if(size == 16)
	{
		EMIT_OP_REG_NUM(ctx.ctx, o_shl, rEAX, 4); // 32 bit shift is ok, top bits are zero
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEAX, sDWORD, rEAX, 1, rEDX, 0);
	}
	else
	{
		EMIT_OP_REG_NUM(ctx.ctx, o_imul, rEAX, size); // 32 bit multiplication is ok, top bits are zero
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEAX, sDWORD, rEAX, 1, rEDX, 0);
	}

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store to target
#endif
}